

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebox.c
# Opt level: O1

void ec_sync(int64 reftime,int64 cycletime,int64 *offsettime)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  lVar1 = (reftime + -50000) % cycletime;
  lVar2 = 0;
  if (cycletime / 2 < lVar1) {
    lVar2 = cycletime;
  }
  lVar3 = lVar1 - lVar2;
  if (lVar3 != 0 && lVar2 <= lVar1) {
    integral = integral + 1;
  }
  if (lVar3 < 0) {
    integral = integral + -1;
  }
  lVar2 = SUB168(SEXT816(-0x6666666666666667) * SEXT816(integral),8);
  lVar3 = SUB168(SEXT816(lVar3) * SEXT816(0x5c28f5c28f5c28f5),8) - lVar3;
  *offsettime = ((lVar2 >> 3) - (lVar2 >> 0x3f)) + ((lVar3 >> 6) - (lVar3 >> 0x3f));
  return;
}

Assistant:

void ec_sync(int64 reftime, int64 cycletime , int64 *offsettime)
{
   int64 delta;
   /* set linux sync point 50us later than DC sync, just as example */
   delta = (reftime - 50000) % cycletime;
   if(delta> (cycletime /2)) { delta= delta - cycletime; }
   if(delta>0){ integral++; }
   if(delta<0){ integral--; }
   *offsettime = -(delta / 100) - (integral /20);
}